

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  size_type __n;
  pointer pbVar2;
  void *pvVar3;
  ulong uVar4;
  MatchResultListener *pMVar5;
  pointer pcVar6;
  long *plVar7;
  ulong uVar8;
  pointer pcVar9;
  long *plVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  char *sep;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  char *local_70;
  char *local_68;
  vector<char,_std::allocator<char>_> local_60;
  vector<char,_std::allocator<char>_> local_48;
  
  __n = *(size_type *)matrix;
  bVar14 = true;
  if (__n != 0 || *(size_type *)(matrix + 8) != 0) {
    if (__n == *(size_type *)(matrix + 8) || *(int *)this != 3) {
      local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ = 0;
      std::vector<char,_std::allocator<char>_>::vector
                (&local_48,__n,(value_type *)&local_60,(allocator_type *)&local_70);
      local_70 = (char *)((ulong)local_70 & 0xffffffffffffff00);
      std::vector<char,_std::allocator<char>_>::vector
                (&local_60,*(size_type *)(matrix + 8),(value_type *)&local_70,
                 (allocator_type *)&local_68);
      uVar12 = *(ulong *)matrix;
      if (uVar12 != 0) {
        uVar8 = *(ulong *)(matrix + 8);
        uVar4 = 0;
        do {
          if (uVar8 == 0) {
            uVar8 = 0;
          }
          else {
            uVar12 = 0;
            do {
              bVar14 = *(char *)(uVar12 + uVar8 * uVar4 + *(long *)(matrix + 0x10)) == '\x01';
              *(byte *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar4) =
                   *(byte *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar4) | bVar14;
              pbVar1 = (byte *)(CONCAT71(local_60.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_60.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar12);
              *pbVar1 = *pbVar1 | bVar14;
              uVar12 = uVar12 + 1;
              uVar8 = *(ulong *)(matrix + 8);
            } while (uVar12 < uVar8);
            uVar12 = *(ulong *)matrix;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < uVar12);
      }
      uVar11 = *(uint *)this;
      bVar14 = true;
      if ((uVar11 & 1) != 0) {
        local_70 = "where the following matchers don\'t match any elements:\n";
        pcVar6 = (pointer)CONCAT71(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start._1_7_,
                                   local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_1_);
        bVar14 = true;
        if (local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish != pcVar6) {
          uVar12 = 0;
          pcVar9 = local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          do {
            if (pcVar6[uVar12] == '\0') {
              if (listener->stream_ != (ostream *)0x0) {
                pMVar5 = MatchResultListener::operator<<(listener,&local_70);
                pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x138e5d);
                if (pMVar5->stream_ != (ostream *)0x0) {
                  std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
                }
                MatchResultListener::operator<<(pMVar5,(char (*) [3])0x13c68a);
                plVar7 = *(long **)(*(long *)(this + 8) + uVar12 * 8);
                (**(code **)(*plVar7 + 0x10))(plVar7,listener->stream_);
                local_70 = ",\n";
                pcVar6 = (pointer)CONCAT71(local_60.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                                           local_60.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_1_);
                pcVar9 = local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              }
              bVar14 = false;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < (ulong)((long)pcVar9 - (long)pcVar6));
          uVar11 = *(uint *)this;
        }
      }
      if ((uVar11 & 2) != 0) {
        local_70 = "where the following elements don\'t match any matchers:\n";
        local_68 = "\nand ";
        if (bVar14) {
          local_68 = "";
        }
        if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish !=
            local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start) {
          lVar13 = 8;
          uVar12 = 0;
          plVar7 = (long *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
          plVar10 = (long *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish;
          do {
            if (*(char *)((long)plVar7 + uVar12) == '\0') {
              if (listener->stream_ != (ostream *)0x0) {
                pMVar5 = MatchResultListener::operator<<(listener,&local_68);
                pMVar5 = MatchResultListener::operator<<(pMVar5,&local_70);
                pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x138c0c);
                if (pMVar5->stream_ != (ostream *)0x0) {
                  std::ostream::_M_insert<unsigned_long>((ulong)pMVar5->stream_);
                }
                pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [3])0x13c68a);
                if (pMVar5->stream_ != (ostream *)0x0) {
                  pbVar2 = (element_printouts->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pMVar5->stream_,*(char **)((long)pbVar2 + lVar13 + -8),
                             *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar13));
                }
                local_70 = ",\n";
                local_68 = "";
                plVar7 = (long *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                plVar10 = (long *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish;
              }
              bVar14 = false;
            }
            uVar12 = uVar12 + 1;
            lVar13 = lVar13 + 0x20;
          } while (uVar12 < (ulong)((long)plVar10 - (long)plVar7));
        }
      }
      pvVar3 = (void *)CONCAT71(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._1_7_,
                                local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._0_1_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_60.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      if ((long *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      if ((__n != 0) && (listener->stream_ != (ostream *)0x0)) {
        pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
        Elements((UnorderedElementsAreMatcherImplBase *)&local_48,*(size_t *)matrix);
        MatchResultListener::operator<<(pMVar5,(Message *)&local_48);
        if ((long *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0) {
          (**(code **)(*(long *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start + 8))();
        }
      }
      bVar14 = false;
    }
  }
  return bVar14;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  if (matrix.LhsSize() == 0 && matrix.RhsSize() == 0) {
    return true;
  }

  if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
    if (matrix.LhsSize() != matrix.RhsSize()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container. Otherwise we just need to show
      // how many elements there actually are.
      if (matrix.LhsSize() != 0 && listener->IsInterested()) {
        *listener << "which has " << Elements(matrix.LhsSize());
      }
      return false;
    }
  }

  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}